

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O2

void cie_lab(double *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int j;
  long lVar4;
  anon_class_1_0_00000001 *this;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar3 = xyz_whitepoint[2];
  dVar2 = xyz_whitepoint[0];
  dVar7 = 0.0;
  dVar5 = 0.0;
  dVar6 = 0.0;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    dVar1 = p[lVar4];
    dVar5 = dVar5 + dVar1 * rgb_to_xyz[0][lVar4];
    dVar6 = dVar6 + dVar1 * rgb_to_xyz[1][lVar4];
    dVar7 = dVar7 + dVar1 * rgb_to_xyz[2][lVar4];
  }
  this = (anon_class_1_0_00000001 *)p;
  dVar6 = cie_lab::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)p,dVar6 / xyz_whitepoint[1]);
  *p = dVar6 * 116.0 + -16.0;
  dVar5 = cie_lab::anon_class_1_0_00000001::operator()(this,dVar5 / dVar2);
  p[1] = (dVar5 - dVar6) * 500.0;
  dVar5 = cie_lab::anon_class_1_0_00000001::operator()(this,dVar7 / dVar3);
  p[2] = (dVar6 - dVar5) * 200.0;
  return;
}

Assistant:

void cie_lab(double *p) {
    double X = 0.0, Y = 0.0, Z = 0.0, Xw = xyz_whitepoint[0], Yw = xyz_whitepoint[1],
           Zw = xyz_whitepoint[2];

    for (int j = 0; j < 3; ++j) {
        X += p[j] * rgb_to_xyz[0][j];
        Y += p[j] * rgb_to_xyz[1][j];
        Z += p[j] * rgb_to_xyz[2][j];
    }

    auto f = [](double t) -> double {
        double delta = 6.0 / 29.0;
        if (t > delta * delta * delta)
            return cbrt(t);
        else
            return t / (delta * delta * 3.0) + (4.0 / 29.0);
    };

    p[0] = 116.0 * f(Y / Yw) - 16.0;
    p[1] = 500.0 * (f(X / Xw) - f(Y / Yw));
    p[2] = 200.0 * (f(Y / Yw) - f(Z / Zw));
}